

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O0

Variable __thiscall LiteScript::String::GetChar(String *this,Memory *memory,uint i)

{
  Object *this_00;
  Character *__p;
  undefined4 in_register_00000014;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar1;
  Variable VVar2;
  allocator<LiteScript::Character> local_26;
  byte local_25;
  uint local_24;
  allocator<LiteScript::Character> allocator;
  Type *pTStack_20;
  uint i_local;
  Memory *memory_local;
  String *this_local;
  Variable *result;
  
  pTStack_20 = (Type *)CONCAT44(in_register_00000014,i);
  local_25 = 0;
  Memory::Create((Memory *)this,pTStack_20);
  std::allocator<LiteScript::Character>::allocator(&local_26);
  this_00 = Variable::operator->((Variable *)this);
  __p = Object::GetData<LiteScript::Character>(this_00);
  __gnu_cxx::new_allocator<LiteScript::Character>::
  construct<LiteScript::Character,LiteScript::String&,unsigned_int&>
            ((new_allocator<LiteScript::Character> *)&local_26,__p,(String *)memory,&local_24);
  local_25 = 1;
  std::allocator<LiteScript::Character>::~allocator(&local_26);
  puVar1 = extraout_RDX;
  if ((local_25 & 1) == 0) {
    Variable::~Variable((Variable *)this);
    puVar1 = extraout_RDX_00;
  }
  VVar2.nb_ref = puVar1;
  VVar2.obj = (Object *)this;
  return VVar2;
}

Assistant:

LiteScript::Variable LiteScript::String::GetChar(LiteScript::Memory& memory, unsigned int i) {
    Variable result = memory.Create(_type_character);
    std::allocator<Character> allocator;
    allocator.construct(&result->GetData<Character>(), *this, i);
    return result;
}